

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::FuncDecl> __thiscall
mocker::Parser::funcDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  TokIter TVar1;
  size_t sVar2;
  size_t sVar3;
  TokenID TVar4;
  long lVar5;
  mapped_type *pmVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<mocker::ast::FuncDecl> sVar8;
  Position beg;
  Position beg_00;
  Position end_00;
  Position end_01;
  GetTokenID id;
  shared_ptr<mocker::ast::CompoundStmt> body;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  formalParam;
  shared_ptr<mocker::ast::Type> ty;
  shared_ptr<mocker::ast::Identifier> ident;
  anon_class_16_2_20bdb18b throwError;
  element_type *local_60;
  element_type *local_58;
  undefined1 local_50 [16];
  shared_ptr<mocker::ast::Type> retType;
  
  this_00 = *end._M_current;
  throwError.beg._M_current = this_00;
  throwError.iter = (TokIter *)end._M_current;
  type((Parser *)&ty,iter,end);
  if (ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    TVar1._M_current = *end._M_current;
    *(Token **)end._M_current = TVar1._M_current + 1;
    TVar4 = GetTokenID::operator()(&id,TVar1);
    if (TVar4 == Void) goto LAB_00173012;
LAB_00173102:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
LAB_00173012:
    identifier((Parser *)&formalParam,iter,end);
    if (formalParam.
        super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &formalParam.
                  super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      goto LAB_00173102;
    }
    TVar1._M_current = *end._M_current;
    *(Token **)end._M_current = TVar1._M_current + 1;
    TVar4 = GetTokenID::operator()(&id,TVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &formalParam.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var7._M_pi = extraout_RDX;
    if (TVar4 == LeftParen) {
      *(Token **)end._M_current = this_00;
      type((Parser *)&retType,iter,end);
      if (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        TVar4 = GetTokenID::operator()(&id,*end._M_current);
        if (TVar4 != Void) goto LAB_00173312;
        *(long *)end._M_current = *(long *)end._M_current + 0x38;
      }
      identifier((Parser *)&ident,iter,end);
      formalParam.
      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      formalParam.
      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      formalParam.
      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TVar4 = GetTokenID::operator()(&id,(Token *)(*(long *)end._M_current + 0x38));
      if (TVar4 == RightParen) {
        lVar5 = *(long *)end._M_current + 0x38;
        *(long *)end._M_current = lVar5;
      }
      else {
        do {
          *(long *)end._M_current = *(long *)end._M_current + 0x38;
          type((Parser *)&ty,iter,end);
          if (ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            funcDecl::anon_class_16_2_20bdb18b::operator()(&throwError);
LAB_001732fe:
            funcDecl::anon_class_16_2_20bdb18b::operator()(&throwError);
            goto LAB_00173308;
          }
          identifier((Parser *)&body,iter,end);
          if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0) goto LAB_001732fe;
          local_58 = ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pmVar6 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)iter[2]._M_current,(key_type *)&local_58);
          sVar2 = (pmVar6->first).line;
          sVar3 = (pmVar6->first).col;
          local_60 = body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
          pmVar6 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)iter[2]._M_current,(key_type *)&local_60);
          beg.col = sVar2;
          beg.line = (size_t)iter;
          end_00.col = (pmVar6->second).line;
          end_00.line = sVar3;
          makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>>
                    ((Parser *)local_50,beg,end_00,
                     (shared_ptr<mocker::ast::Type> *)(pmVar6->second).col,
                     (shared_ptr<mocker::ast::Identifier> *)&ty);
          std::
          vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
          ::emplace_back<std::shared_ptr<mocker::ast::VarDeclStmt>>
                    ((vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
                      *)&formalParam,(shared_ptr<mocker::ast::VarDeclStmt> *)local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          TVar4 = GetTokenID::operator()(&id,*end._M_current);
        } while (TVar4 == Comma);
        lVar5 = *(long *)end._M_current;
      }
      *(long *)end._M_current = lVar5 + 0x38;
      compoundStmt((Parser *)&body,iter,end);
      if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
LAB_00173308:
        funcDecl::anon_class_16_2_20bdb18b::operator()(&throwError);
LAB_00173312:
        __assert_fail("id(iter) == TokenID::Void",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x285,
                      "std::shared_ptr<ast::FuncDecl> mocker::Parser::funcDecl(TokIter &, TokIter)")
        ;
      }
      Token::position(this_00);
      local_50._0_8_ =
           body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pmVar6 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)local_50);
      beg_00.col = (size_t)ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
      beg_00.line = (size_t)iter;
      end_01.col = (pmVar6->second).line;
      end_01.line = (size_t)ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
      makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
                (this,beg_00,end_01,(shared_ptr<mocker::ast::Type> *)(pmVar6->second).col,
                 (shared_ptr<mocker::ast::Identifier> *)&retType,
                 (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                  *)&ident,(shared_ptr<mocker::ast::CompoundStmt> *)&formalParam);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
      ::~vector(&formalParam);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var7._M_pi = extraout_RDX_01;
      goto LAB_001732df;
    }
  }
  *(Token **)end._M_current = this_00;
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_001732df:
  sVar8.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::FuncDecl>)
         sVar8.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::FuncDecl> Parser::funcDecl(TokIter &iter, TokIter end) {
  auto beg = iter;
  auto id = GetTokenID(end);
  auto throwError = [beg, &iter] {
    throw SyntaxError(beg->position().first, iter->position().second);
  };

  if (!(type(iter, end) || id(iter++) == TokenID::Void) ||
      !identifier(iter, end) || id(iter++) != TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;
  auto retType = type(iter, end);
  if (!retType) {
    assert(id(iter) == TokenID::Void);
    iter++;
  }
  auto ident = identifier(iter, end);

  std::vector<std::shared_ptr<ast::VarDeclStmt>> formalParam;
  if (id(iter + 1) != TokenID::RightParen) {
    do {
      // Now [iter] points to a Comma or a LeftParen
      ++iter;
      auto ty = type(iter, end);
      if (!ty)
        throwError();
      auto paramName = identifier(iter, end);
      if (!ident)
        throwError();
      formalParam.emplace_back(makeNode<ast::VarDeclStmt>(
          pos[ty->getID()].first, pos[paramName->getID()].second, std::move(ty),
          std::move(paramName)));
    } while (id(iter) == TokenID::Comma);
  } else {
    ++iter;
  }
  ++iter;
  auto body = compoundStmt(iter, end);
  if (!body)
    throwError();
  return makeNode<ast::FuncDecl>(beg->position().first,
                                 pos[body->getID()].second, retType, ident,
                                 std::move(formalParam), body);
}